

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O1

size_t __thiscall indigox::ElectronOpt::Run(ElectronOpt *this)

{
  pointer ppVar1;
  element_type *peVar2;
  pointer ppVar3;
  pointer ppVar4;
  LocalOptimisation *this_00;
  AStarOptimisation *this_01;
  FPTOptimisation *this_02;
  runtime_error *this_03;
  shared_ptr<indigox::MolecularGraph> local_28;
  
  ppVar1 = (this->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->possibleLocations_).
      super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->possibleLocations_).
    super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  if ((this->scores_)._M_h._M_element_count == 0) {
    LoadScores(this);
  }
  if (Options::AssignElectrons::ALGORITHM == FPT) {
    this_02 = (FPTOptimisation *)operator_new(0x130);
    algorithm::FPTOptimisation::FPTOptimisation(this_02,this);
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::FPTOptimisation>
              (&(this->algo_).
                super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
               ,this_02);
  }
  else if (Options::AssignElectrons::ALGORITHM == ASTAR) {
    this_01 = (AStarOptimisation *)operator_new(0x198);
    algorithm::AStarOptimisation::AStarOptimisation(this_01,this);
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::AStarOptimisation>
              (&(this->algo_).
                super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
               ,this_01);
  }
  else {
    if (Options::AssignElectrons::ALGORITHM != LOCAL_OPTIMISATION) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_03,"Unsupported optimisation algorithm");
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (LocalOptimisation *)operator_new(0xb8);
    algorithm::LocalOptimisation::LocalOptimisation(this_00,this);
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::LocalOptimisation>
              (&(this->algo_).
                super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
               ,this_00);
  }
  local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  SetMolecularGraph(this,&local_28);
  if (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  DetermineElectronsToAdd(this);
  DeterminePotentialElectronLocations(this);
  if (Options::AssignElectrons::ALGORITHM == ASTAR) {
    SortPotentialLocations(this);
  }
  algorithm::ElectronOptimisationAlgorithm::PopulateMVP2EV
            ((this->algo_).
             super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  (*((this->algo_).
     super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->_vptr_ElectronOptimisationAlgorithm[2])();
  peVar2 = (this->algo_).
           super___shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ppVar3 = (peVar2->minDistributions_).
           super__Vector_base<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = (peVar2->minDistributions_).
           super__Vector_base<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->finalScore_ = peVar2->minScore_;
  return ((long)ppVar3 - (long)ppVar4 >> 3) * -0x3333333333333333;
}

Assistant:

size_t ElectronOpt::Run() {
  possibleLocations_.clear();
  if (scores_.empty()) LoadScores();
  
  switch (opt_::ALGORITHM) {
    case opt_::Algorithm::LOCAL_OPTIMISATION:
      algo_.reset(new algorithm::LocalOptimisation(this));
      break;
    case opt_::Algorithm::ASTAR:
      algo_.reset(new algorithm::AStarOptimisation(this));
      break;
    case opt_::Algorithm::FPT:
      algo_.reset(new algorithm::FPTOptimisation(this));
      break;
      
    default:
      throw std::runtime_error("Unsupported optimisation algorithm");
      break;
  }
  SetMolecularGraph(molGraph_);
  DetermineElectronsToAdd();
  DeterminePotentialElectronLocations();
  if (opt_::ALGORITHM == opt_::Algorithm::ASTAR) SortPotentialLocations();
  algo_->PopulateMVP2EV();
  algo_->Run();
  size_t res = algo_->GetResultCount();
  finalScore_ = algo_->GetResultEnergy();
  return res;
}